

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O3

void gimage::paste<float>
               (Image<float,_gimage::PixelTraits<float>_> *image,
               Image<float,_gimage::PixelTraits<float>_> *image2,long i0,long k0,int d0,
               float opacity)

{
  int iVar1;
  long lVar2;
  long lVar3;
  float ***pppfVar4;
  float ***pppfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long k;
  long lVar11;
  long lVar12;
  
  if (1.0 <= opacity) {
    iVar1 = image2->depth;
    if (0 < (long)iVar1) {
      lVar2 = image2->height;
      lVar9 = 0;
      do {
        lVar10 = lVar9 + d0;
        if ((-1 < lVar10 && 0 < lVar2) && lVar10 < image->depth) {
          lVar3 = image2->width;
          lVar11 = 0;
          do {
            lVar12 = lVar11 + k0;
            if ((-1 < lVar12 && 0 < lVar3) && lVar12 < image->height) {
              pppfVar4 = image2->img;
              pppfVar5 = image->img;
              lVar8 = 0;
              lVar6 = i0;
              lVar7 = lVar3;
              do {
                if ((-1 < lVar6) && (lVar6 < image->width)) {
                  pppfVar5[lVar10][lVar12][lVar6] =
                       *(float *)((long)pppfVar4[lVar9][lVar11] + lVar8);
                }
                lVar6 = lVar6 + 1;
                lVar8 = lVar8 + 4;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != lVar2);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
  }
  else {
    iVar1 = image2->depth;
    if (0 < (long)iVar1) {
      if (opacity <= 0.0) {
        opacity = 0.0;
      }
      lVar2 = image2->height;
      lVar9 = 0;
      do {
        lVar10 = lVar9 + d0;
        if ((-1 < lVar10 && 0 < lVar2) && lVar10 < image->depth) {
          lVar3 = image2->width;
          lVar11 = 0;
          do {
            lVar12 = lVar11 + k0;
            if ((-1 < lVar12 && 0 < lVar3) && lVar12 < image->height) {
              pppfVar4 = image->img;
              pppfVar5 = image2->img;
              lVar8 = 0;
              lVar6 = i0;
              lVar7 = lVar3;
              do {
                if ((-1 < lVar6) && (lVar6 < image->width)) {
                  pppfVar4[lVar10][lVar12][lVar6] =
                       *(float *)((long)pppfVar5[lVar9][lVar11] + lVar8) * opacity +
                       pppfVar4[lVar10][lVar12][lVar6] * (1.0 - opacity);
                }
                lVar6 = lVar6 + 1;
                lVar8 = lVar8 + 4;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != lVar2);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
  }
  return;
}

Assistant:

void paste(Image<T> &image, const Image<T> &image2, long i0=0, long k0=0,
                             int d0=0, float opacity=1.0f)
{
  if (opacity < 1)
  {
    opacity=std::max(0.0f, opacity);

    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                float v=(1-opacity)*image.get(i0+i, k0+k, d0+d);
                v+=opacity*image2.get(i, k, d);
                image.set(i0+i, k0+k, d0+d, static_cast<typename Image<T>::store_t>(v));
              }
  }
  else
  {
    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                image.set(i0+i, k0+k, d0+d, image2.get(i, k, d));
              }
  }
}